

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

CWalletTx * __thiscall
wallet::wallet_tests::ListCoinsTestingSetup::AddTx
          (ListCoinsTestingSetup *this,CRecipient *recipient)

{
  uint256 block_hash;
  initializer_list<wallet::CRecipient> __l;
  initializer_list<CMutableTransaction> __l_00;
  bool bVar1;
  pointer ppVar2;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  iterator it;
  CMutableTransaction blocktx;
  CTransactionRef tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  Result<wallet::CreatedTransactionResult> res;
  CCoinControl dummy;
  ChainstateManager *in_stack_fffffffffffff718;
  ChainstateManager *this_00;
  CRecipient *in_stack_fffffffffffff720;
  lazy_ostream *prev;
  CWallet *in_stack_fffffffffffff728;
  CWallet *this_01;
  TxStateConfirmed *__rhs;
  undefined4 in_stack_fffffffffffff738;
  int in_stack_fffffffffffff73c;
  CTransaction *in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  const_string *in_stack_fffffffffffff750;
  Chainstate *in_stack_fffffffffffff758;
  iterator in_stack_fffffffffffff760;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffff768;
  TestChain100Setup *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff7d0;
  undefined1 sign;
  CCoinControl *in_stack_fffffffffffff7d8;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  CWallet *in_stack_fffffffffffff7e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff810;
  mapValue_t *in_stack_fffffffffffff818;
  _Optional_payload_base<unsigned_int> in_stack_fffffffffffff820;
  CWallet *in_stack_fffffffffffff828;
  undefined1 *puVar4;
  undefined1 *local_730;
  const_string local_6b0 [2];
  lazy_ostream local_690 [2];
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_670;
  assertion_result local_668 [2];
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> local_630;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  const_string local_570 [2];
  lazy_ostream local_550 [2];
  assertion_result local_530 [6];
  optional<unsigned_int> local_498 [10];
  ChainstateManager *local_448;
  lazy_ostream *plStack_440;
  CWallet *local_438;
  TxStateConfirmed *pTStack_430;
  undefined1 local_3c0 [56];
  undefined1 local_388 [112];
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e0 [96];
  undefined1 local_280 [632];
  long local_8;
  
  sign = (undefined1)((ulong)in_stack_fffffffffffff7d0 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff718);
  CCoinControl::CCoinControl((CCoinControl *)in_stack_fffffffffffff770);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator*
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff728);
  CRecipient::CRecipient((CRecipient *)in_stack_fffffffffffff728,in_stack_fffffffffffff720);
  std::allocator<wallet::CRecipient>::allocator
            ((allocator<wallet::CRecipient> *)in_stack_fffffffffffff718);
  __l._M_len = (size_type)in_stack_fffffffffffff768;
  __l._M_array = in_stack_fffffffffffff760;
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
             in_stack_fffffffffffff758,__l,(allocator_type *)in_stack_fffffffffffff750);
  std::optional<unsigned_int>::optional(local_498);
  CreateTransaction(in_stack_fffffffffffff7e8,
                    (vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
                    CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                    (optional<unsigned_int>)in_stack_fffffffffffff820,in_stack_fffffffffffff7d8,
                    (bool)sign);
  std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>::~vector
            ((vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *)
             in_stack_fffffffffffff728);
  std::allocator<wallet::CRecipient>::~allocator
            ((allocator<wallet::CRecipient> *)in_stack_fffffffffffff718);
  local_730 = local_280;
  do {
    local_730 = local_730 + -0x60;
    CRecipient::~CRecipient((CRecipient *)in_stack_fffffffffffff718);
  } while (local_730 != local_2e0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)in_stack_fffffffffffff720,(unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (const_string *)in_stack_fffffffffffff740);
    boost::test_tools::assertion_result::
    assertion_result<util::Result<wallet::CreatedTransactionResult>>
              ((assertion_result *)in_stack_fffffffffffff728,
               (Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff720);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)in_stack_fffffffffffff720,(unsigned_long)in_stack_fffffffffffff718);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff720,
               (basic_cstring<const_char> *)in_stack_fffffffffffff718);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff728,
               (pointer)in_stack_fffffffffffff720,(unsigned_long)in_stack_fffffffffffff718);
    in_stack_fffffffffffff718 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_530,local_550,local_570,599,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff718);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff718);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::Result<wallet::CreatedTransactionResult>::operator->
            ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff718);
  std::shared_ptr<const_CTransaction>::operator=
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff728,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff720);
  util::Result<wallet::CreatedTransactionResult>::~Result
            ((Result<wallet::CreatedTransactionResult> *)in_stack_fffffffffffff718);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff718,
             (shared_ptr<const_CTransaction> *)0xe49af6);
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_308 = 0;
  uStack_300 = 0;
  local_318 = 0;
  uStack_310 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)in_stack_fffffffffffff718);
  local_598 = 0;
  uStack_590 = 0;
  local_588 = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_fffffffffffff718);
  CWallet::CommitTransaction
            (in_stack_fffffffffffff828,(CTransactionRef *)in_stack_fffffffffffff820,
             in_stack_fffffffffffff818,in_stack_fffffffffffff810);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffff728);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffff718);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff718);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff718);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff718);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff758,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff750,
             (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             (char *)in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             SUB41((uint)in_stack_fffffffffffff738 >> 0x18,0));
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff718);
  CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff718);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_fffffffffffff718);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::at((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
        *)in_stack_fffffffffffff728,(key_type *)in_stack_fffffffffffff720);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff728);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             in_stack_fffffffffffff740);
  CMutableTransaction::operator=
            ((CMutableTransaction *)in_stack_fffffffffffff728,
             (CMutableTransaction *)in_stack_fffffffffffff720);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff718);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff718);
  CMutableTransaction::CMutableTransaction
            ((CMutableTransaction *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             (CMutableTransaction *)in_stack_fffffffffffff740);
  std::allocator<CMutableTransaction>::allocator
            ((allocator<CMutableTransaction> *)in_stack_fffffffffffff718);
  __l_00._M_len = (size_type)in_stack_fffffffffffff768;
  __l_00._M_array = (iterator)in_stack_fffffffffffff760;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff758,__l_00,(allocator_type *)in_stack_fffffffffffff750);
  CKey::GetPubKey((CKey *)in_stack_fffffffffffff740);
  GetScriptForRawPubKey((CPubKey *)in_stack_fffffffffffff760);
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,
             (CScript *)in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  CBlock::~CBlock((CBlock *)in_stack_fffffffffffff718);
  CScript::~CScript((CScript *)in_stack_fffffffffffff718);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_fffffffffffff728);
  std::allocator<CMutableTransaction>::~allocator
            ((allocator<CMutableTransaction> *)in_stack_fffffffffffff718);
  puVar4 = local_3c0;
  puVar3 = local_388;
  do {
    puVar3 = puVar3 + -0x38;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff718);
  } while (puVar3 != puVar4);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff718);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff758,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff750,
             (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             (char *)in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             SUB41((uint)in_stack_fffffffffffff738 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c,
             (char *)in_stack_fffffffffffff740,
             (char *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff718);
  ChainstateManager::GetMutex(in_stack_fffffffffffff718);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff718);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff758,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff750,
             (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
             (char *)in_stack_fffffffffffff740,in_stack_fffffffffffff73c,
             SUB41((uint)in_stack_fffffffffffff738 >> 0x18,0));
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)
             in_stack_fffffffffffff718);
  CWallet::GetLastBlockHeight(in_stack_fffffffffffff728);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff718);
  ChainstateManager::ActiveChain(in_stack_fffffffffffff718);
  CChain::Tip((CChain *)in_stack_fffffffffffff728);
  CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff728);
  block_hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_fffffffffffff748;
  block_hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)in_stack_fffffffffffff748 >> 8)
  ;
  block_hash.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_fffffffffffff748 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_fffffffffffff748 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = in_stack_fffffffffffff740;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_fffffffffffff74c;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_fffffffffffff74c >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_fffffffffffff74c >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_fffffffffffff74c >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_fffffffffffff750;
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_fffffffffffff758;
  CWallet::SetLastBlockProcessed(local_438,(int)((ulong)plStack_440 >> 0x20),block_hash);
  std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
            ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)local_448);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_448);
  CTransaction::GetHash((CTransaction *)local_448);
  transaction_identifier::operator_cast_to_uint256_((transaction_identifier<false> *)local_448);
  local_630._M_cur =
       (__node_type *)
       std::
       unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
       ::find((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
               *)plStack_440,(key_type *)local_448);
  this_00 = local_448;
  prev = plStack_440;
  this_01 = local_438;
  __rhs = pTStack_430;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff758,in_stack_fffffffffffff750,
               CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
               (const_string *)in_stack_fffffffffffff740);
    std::unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_>::operator->
              ((unique_ptr<wallet::CWallet,_std::default_delete<wallet::CWallet>_> *)this_00);
    local_670._M_cur =
         (__node_type *)
         std::
         unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                *)prev);
    std::__detail::operator==
              ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)this_01,
               (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)prev);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_668,local_690,local_6b0,0x266,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChain(this_00);
  CChain::Tip((CChain *)this_01);
  CBlockIndex::GetBlockHash((CBlockIndex *)this_01);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::ActiveChain(this_00);
  CChain::Height((CChain *)this_00);
  TxStateConfirmed::TxStateConfirmed
            ((TxStateConfirmed *)this_01,(uint256 *)prev,(int)((ulong)this_00 >> 0x20),(int)this_00)
  ;
  std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
  operator->((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)this_00);
  std::
  variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateBlockConflicted,wallet::TxStateInactive,wallet::TxStateUnrecognized>
  ::operator=((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
               *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),__rhs);
  ppVar2 = std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
           operator->((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                      this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)this_00);
  CCoinControl::~CCoinControl((CCoinControl *)this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr((shared_ptr<const_CTransaction> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &ppVar2->second;
}

Assistant:

CWalletTx& AddTx(CRecipient recipient)
    {
        CTransactionRef tx;
        CCoinControl dummy;
        {
            auto res = CreateTransaction(*wallet, {recipient}, /*change_pos=*/std::nullopt, dummy);
            BOOST_CHECK(res);
            tx = res->tx;
        }
        wallet->CommitTransaction(tx, {}, {});
        CMutableTransaction blocktx;
        {
            LOCK(wallet->cs_wallet);
            blocktx = CMutableTransaction(*wallet->mapWallet.at(tx->GetHash()).tx);
        }
        CreateAndProcessBlock({CMutableTransaction(blocktx)}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));

        LOCK(wallet->cs_wallet);
        LOCK(Assert(m_node.chainman)->GetMutex());
        wallet->SetLastBlockProcessed(wallet->GetLastBlockHeight() + 1, m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        auto it = wallet->mapWallet.find(tx->GetHash());
        BOOST_CHECK(it != wallet->mapWallet.end());
        it->second.m_state = TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/1};
        return it->second;
    }